

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genmbcs.cpp
# Opt level: O2

UBool MBCSAddToUnicode(MBCSData *mbcsData,uint8_t *bytes,int32_t length,UChar32 c,int8_t flag)

{
  ushort uVar1;
  UCMFile *pUVar2;
  int iVar3;
  uint16_t *puVar4;
  long lVar5;
  ushort uVar6;
  undefined4 in_register_0000000c;
  ulong uVar7;
  uint uVar8;
  FILE *__stream;
  char *pcVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  char buffer [10];
  
  __stream = _stderr;
  uVar7 = CONCAT44(in_register_0000000c,c);
  pUVar2 = mbcsData->ucm;
  if ((pUVar2->states).countStates == 0) {
    fwrite("error: there is no state information!\n",0x26,1,_stderr);
    return '\0';
  }
  iVar3 = 0;
  uVar8 = 0;
  if (length == 2) {
    uVar8 = (uint)((pUVar2->states).outputType == '\f');
  }
  uVar12 = 1;
  while (uVar11 = *(uint *)((long)(pUVar2->states).stateTable[0] +
                           (ulong)bytes[uVar12 - 1] * 4 + (ulong)(uVar8 << 10)), -1 < (int)uVar11) {
    if ((uint)length == uVar12) {
      printBytes(buffer,bytes,length);
      pcVar9 = "error: byte sequence too short, ends in non-final state %hu: 0x%s (U+%x)\n";
      uVar11 = uVar8;
      goto LAB_001e6c38;
    }
    uVar8 = uVar11 >> 0x18;
    iVar3 = iVar3 + (uVar11 & 0xffffff);
    uVar12 = uVar12 + 1;
  }
  if ((int)uVar12 < length) {
    printBytes(buffer,bytes,length);
    fprintf(__stream,"error: byte sequence too long by %d bytes, final state %u: 0x%s (U+%x)\n",
            (ulong)(uint)(length - (int)uVar12),(ulong)uVar8,buffer,c);
    return '\0';
  }
  uVar6 = (ushort)c;
  switch(uVar11 >> 0x14 & 0xf) {
  case 0:
  case 1:
  case 2:
  case 3:
    if ((uVar11 & 0x80ffffff) != 0x8000fffe) {
      uVar10 = uVar11 & 0xfffff;
      if ((uVar11 >> 0x14 & 0xd) != 0) {
        uVar10 = uVar10 + 0x10000;
      }
      if (-1 < flag) {
        printBytes(buffer,bytes,length);
LAB_001e6f1d:
        pcVar9 = "error: duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n";
        uVar12 = (ulong)uVar10;
LAB_001e6f20:
        fprintf(__stream,pcVar9,uVar7,buffer,uVar12);
        return '\0';
      }
      if (VERBOSE != '\0') {
        printBytes(buffer,bytes,length);
        fprintf(__stream,"duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n",uVar7,
                buffer,(ulong)uVar10);
      }
    }
    uVar10 = c - 0x10000;
    if (c < 0x10000) {
      uVar10 = c;
    }
    *(uint *)((long)(mbcsData->ucm->states).stateTable[0] +
             (ulong)bytes[uVar12 - 1] * 4 + (ulong)(uVar8 << 10)) =
         (uint)(flag == '\x03') << 0x15 | (uint)(0xffff < c) << 0x14 | uVar11 & 0xff000000 | uVar10;
    break;
  case 4:
    uVar8 = (uVar11 & 0xffff) + iVar3;
    uVar10 = (uint)mbcsData->unicodeCodeUnits[uVar8];
    if (uVar10 == 0xfffe) {
      uVar11 = ucm_findFallback(mbcsData->toUFallbacks,mbcsData->countToUFallbacks,uVar8);
      if (-1 < (int)uVar11) {
        iVar3 = mbcsData->countToUFallbacks;
        uVar10 = mbcsData->toUFallbacks[uVar11].codePoint;
        mbcsData->toUFallbacks[uVar11] = mbcsData->toUFallbacks[(long)iVar3 + -1];
        mbcsData->countToUFallbacks = iVar3 + -1;
        if (uVar10 != 0xffffffff) goto LAB_001e6b4d;
      }
    }
    else {
LAB_001e6b4d:
      __stream = _stderr;
      if (-1 < flag) {
        printBytes(buffer,bytes,length);
        uVar7 = (ulong)(uint)c;
        goto LAB_001e6f1d;
      }
      if (VERBOSE != '\0') {
        printBytes(buffer,bytes,length);
        fprintf(__stream,"duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n",c,buffer,
                (ulong)uVar10);
      }
    }
    __stream = _stderr;
    if (0xffff < c) {
      printBytes(buffer,bytes,length);
      pcVar9 = "error: code point does not fit into valid-16-bit state at U+%04x<->0x%s\n";
      goto LAB_001e6ed8;
    }
    if ('\0' < flag) {
      if (mbcsData->unicodeCodeUnits[uVar8] != 0xfffe) {
        return '\x01';
      }
      uVar11 = ucm_findFallback(mbcsData->toUFallbacks,mbcsData->countToUFallbacks,uVar8);
      if ((int)uVar11 < 0) {
        iVar3 = mbcsData->countToUFallbacks;
        lVar5 = (long)iVar3;
        if (0x1fff < lVar5) {
          fprintf(_stderr,"error: too many toUnicode fallbacks, currently at: U+%x\n",c);
          return '\0';
        }
        mbcsData->toUFallbacks[lVar5].offset = uVar8;
        mbcsData->toUFallbacks[lVar5].codePoint = c;
        mbcsData->countToUFallbacks = iVar3 + 1;
        return '\x01';
      }
      mbcsData->toUFallbacks[uVar11].codePoint = c;
      return '\x01';
    }
    mbcsData->unicodeCodeUnits[uVar8] = uVar6;
    break;
  case 5:
    uVar11 = (uVar11 & 0xffff) + iVar3;
    puVar4 = mbcsData->unicodeCodeUnits;
    uVar1 = puVar4[uVar11];
    uVar8 = (uint)uVar1;
    if (uVar1 < 0xfffe) {
      if (0xd7ff < uVar1) {
        if (uVar1 < 0xe000) {
          uVar8 = (uVar1 & 0x3ff) * 0x400 + (puVar4[uVar11 + 1] & 0x3ff) + 0x10000;
        }
        else {
          uVar8 = (uint)puVar4[uVar11 + 1];
        }
      }
      if (-1 < flag) {
        printBytes(buffer,bytes,length);
        pcVar9 = "error: duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n";
        uVar7 = (ulong)(uint)c;
        uVar12 = (ulong)uVar8;
        goto LAB_001e6f20;
      }
      if (VERBOSE != '\0') {
        printBytes(buffer,bytes,length);
        fprintf(__stream,"duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n",c,buffer,
                (ulong)uVar8);
      }
LAB_001e6cd9:
      if (c < 0xd800) {
        mbcsData->unicodeCodeUnits[uVar11] = uVar6;
        return '\x01';
      }
      if (0xffff < (uint)c) {
        puVar4 = mbcsData->unicodeCodeUnits;
        puVar4[uVar11] = (short)(uVar7 >> 10) + 0xd7c0;
        puVar4[uVar11 + 1] = uVar6 & 0x3ff | 0xdc00;
        return '\x01';
      }
      puVar4 = mbcsData->unicodeCodeUnits;
      uVar12 = (ulong)(uVar11 + 1);
      puVar4[uVar11] = 0xe000;
    }
    else {
      if (flag < '\x01') goto LAB_001e6cd9;
      if (c < 0x10000) {
        uVar12 = (ulong)(uVar11 + 1);
        puVar4[uVar11] = 0xe001;
      }
      else {
        uVar12 = (ulong)(uVar11 + 1);
        puVar4[uVar11] = (short)((uint)c >> 10) + 0xdbc0;
        uVar7 = (ulong)(c & 0x3ffU | 0xdc00);
      }
    }
    puVar4[uVar12] = (uint16_t)uVar7;
    break;
  case 6:
    printBytes(buffer,bytes,length);
    pcVar9 = "error: byte sequence ends in unassigned state at U+%04x<->0x%s\n";
    goto LAB_001e6ed8;
  case 7:
    printBytes(buffer,bytes,length);
    pcVar9 = "error: byte sequence ends in illegal state at U+%04x<->0x%s\n";
    goto LAB_001e6ed8;
  case 8:
    printBytes(buffer,bytes,length);
    pcVar9 = "error: byte sequence ends in state-change-only at U+%04x<->0x%s\n";
LAB_001e6ed8:
    fprintf(__stream,pcVar9,c,buffer);
    return '\0';
  default:
    printBytes(buffer,bytes,length);
    pcVar9 = 
    "internal error: byte sequence reached reserved action code, entry 0x%02x: 0x%s (U+%x)\n";
LAB_001e6c38:
    uVar7 = (ulong)uVar11;
    uVar12 = (ulong)(uint)c;
    goto LAB_001e6f20;
  }
  return '\x01';
}

Assistant:

static UBool
MBCSAddToUnicode(MBCSData *mbcsData,
                 const uint8_t *bytes, int32_t length,
                 UChar32 c,
                 int8_t flag) {
    char buffer[10];
    uint32_t offset=0;
    int32_t i=0, entry, old;
    uint8_t state=0;

    if(mbcsData->ucm->states.countStates==0) {
        fprintf(stderr, "error: there is no state information!\n");
        return FALSE;
    }

    /* for SI/SO (like EBCDIC-stateful), double-byte sequences start in state 1 */
    if(length==2 && mbcsData->ucm->states.outputType==MBCS_OUTPUT_2_SISO) {
        state=1;
    }

    /*
     * Walk down the state table like in conversion,
     * much like getNextUChar().
     * We assume that c<=0x10ffff.
     */
    for(i=0;;) {
        entry=mbcsData->ucm->states.stateTable[state][bytes[i++]];
        if(MBCS_ENTRY_IS_TRANSITION(entry)) {
            if(i==length) {
                fprintf(stderr, "error: byte sequence too short, ends in non-final state %hu: 0x%s (U+%x)\n",
                    (short)state, printBytes(buffer, bytes, length), (int)c);
                return FALSE;
            }
            state=(uint8_t)MBCS_ENTRY_TRANSITION_STATE(entry);
            offset+=MBCS_ENTRY_TRANSITION_OFFSET(entry);
        } else {
            if(i<length) {
                fprintf(stderr, "error: byte sequence too long by %d bytes, final state %u: 0x%s (U+%x)\n",
                    (int)(length-i), state, printBytes(buffer, bytes, length), (int)c);
                return FALSE;
            }
            switch(MBCS_ENTRY_FINAL_ACTION(entry)) {
            case MBCS_STATE_ILLEGAL:
                fprintf(stderr, "error: byte sequence ends in illegal state at U+%04x<->0x%s\n",
                    (int)c, printBytes(buffer, bytes, length));
                return FALSE;
            case MBCS_STATE_CHANGE_ONLY:
                fprintf(stderr, "error: byte sequence ends in state-change-only at U+%04x<->0x%s\n",
                    (int)c, printBytes(buffer, bytes, length));
                return FALSE;
            case MBCS_STATE_UNASSIGNED:
                fprintf(stderr, "error: byte sequence ends in unassigned state at U+%04x<->0x%s\n",
                    (int)c, printBytes(buffer, bytes, length));
                return FALSE;
            case MBCS_STATE_FALLBACK_DIRECT_16:
            case MBCS_STATE_VALID_DIRECT_16:
            case MBCS_STATE_FALLBACK_DIRECT_20:
            case MBCS_STATE_VALID_DIRECT_20:
                if(MBCS_ENTRY_SET_STATE(entry, 0)!=MBCS_ENTRY_FINAL(0, MBCS_STATE_VALID_DIRECT_16, 0xfffe)) {
                    /* the "direct" action's value is not "valid-direct-16-unassigned" any more */
                    if(MBCS_ENTRY_FINAL_ACTION(entry)==MBCS_STATE_VALID_DIRECT_16 || MBCS_ENTRY_FINAL_ACTION(entry)==MBCS_STATE_FALLBACK_DIRECT_16) {
                        old=MBCS_ENTRY_FINAL_VALUE(entry);
                    } else {
                        old=0x10000+MBCS_ENTRY_FINAL_VALUE(entry);
                    }
                    if(flag>=0) {
                        fprintf(stderr, "error: duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n",
                            (int)c, printBytes(buffer, bytes, length), (int)old);
                        return FALSE;
                    } else if(VERBOSE) {
                        fprintf(stderr, "duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n",
                            (int)c, printBytes(buffer, bytes, length), (int)old);
                    }
                    /*
                     * Continue after the above warning
                     * if the precision of the mapping is unspecified.
                     */
                }
                /* reassign the correct action code */
                entry=MBCS_ENTRY_FINAL_SET_ACTION(entry, (MBCS_STATE_VALID_DIRECT_16+(flag==3 ? 2 : 0)+(c>=0x10000 ? 1 : 0)));

                /* put the code point into bits 22..7 for BMP, c-0x10000 into 26..7 for others */
                if(c<=0xffff) {
                    entry=MBCS_ENTRY_FINAL_SET_VALUE(entry, c);
                } else {
                    entry=MBCS_ENTRY_FINAL_SET_VALUE(entry, c-0x10000);
                }
                mbcsData->ucm->states.stateTable[state][bytes[i-1]]=entry;
                break;
            case MBCS_STATE_VALID_16:
                /* bits 26..16 are not used, 0 */
                /* bits 15..7 contain the final offset delta to one 16-bit code unit */
                offset+=MBCS_ENTRY_FINAL_VALUE_16(entry);
                /* check that this byte sequence is still unassigned */
                if((old=mbcsData->unicodeCodeUnits[offset])!=0xfffe || (old=removeFallback(mbcsData, offset))!=-1) {
                    if(flag>=0) {
                        fprintf(stderr, "error: duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n",
                            (int)c, printBytes(buffer, bytes, length), (int)old);
                        return FALSE;
                    } else if(VERBOSE) {
                        fprintf(stderr, "duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n",
                            (int)c, printBytes(buffer, bytes, length), (int)old);
                    }
                }
                if(c>=0x10000) {
                    fprintf(stderr, "error: code point does not fit into valid-16-bit state at U+%04x<->0x%s\n",
                        (int)c, printBytes(buffer, bytes, length));
                    return FALSE;
                }
                if(flag>0) {
                    /* assign only if there is no precise mapping */
                    if(mbcsData->unicodeCodeUnits[offset]==0xfffe) {
                        return setFallback(mbcsData, offset, c);
                    }
                } else {
                    mbcsData->unicodeCodeUnits[offset]=(uint16_t)c;
                }
                break;
            case MBCS_STATE_VALID_16_PAIR:
                /* bits 26..16 are not used, 0 */
                /* bits 15..7 contain the final offset delta to two 16-bit code units */
                offset+=MBCS_ENTRY_FINAL_VALUE_16(entry);
                /* check that this byte sequence is still unassigned */
                old=mbcsData->unicodeCodeUnits[offset];
                if(old<0xfffe) {
                    int32_t real;
                    if(old<0xd800) {
                        real=old;
                    } else if(old<=0xdfff) {
                        real=0x10000+((old&0x3ff)<<10)+((mbcsData->unicodeCodeUnits[offset+1])&0x3ff);
                    } else /* old<=0xe001 */ {
                        real=mbcsData->unicodeCodeUnits[offset+1];
                    }
                    if(flag>=0) {
                        fprintf(stderr, "error: duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n",
                            (int)c, printBytes(buffer, bytes, length), (int)real);
                        return FALSE;
                    } else if(VERBOSE) {
                        fprintf(stderr, "duplicate codepage byte sequence at U+%04x<->0x%s see U+%04x\n",
                            (int)c, printBytes(buffer, bytes, length), (int)real);
                    }
                }
                if(flag>0) {
                    /* assign only if there is no precise mapping */
                    if(old<=0xdbff || old==0xe000) {
                        /* do nothing */
                    } else if(c<=0xffff) {
                        /* set a BMP fallback code point as a pair with 0xe001 */
                        mbcsData->unicodeCodeUnits[offset++]=0xe001;
                        mbcsData->unicodeCodeUnits[offset]=(uint16_t)c;
                    } else {
                        /* set a fallback surrogate pair with two second surrogates */
                        mbcsData->unicodeCodeUnits[offset++]=(uint16_t)(0xdbc0+(c>>10));
                        mbcsData->unicodeCodeUnits[offset]=(uint16_t)(0xdc00+(c&0x3ff));
                    }
                } else {
                    if(c<0xd800) {
                        /* set a BMP code point */
                        mbcsData->unicodeCodeUnits[offset]=(uint16_t)c;
                    } else if(c<=0xffff) {
                        /* set a BMP code point above 0xd800 as a pair with 0xe000 */
                        mbcsData->unicodeCodeUnits[offset++]=0xe000;
                        mbcsData->unicodeCodeUnits[offset]=(uint16_t)c;
                    } else {
                        /* set a surrogate pair */
                        mbcsData->unicodeCodeUnits[offset++]=(uint16_t)(0xd7c0+(c>>10));
                        mbcsData->unicodeCodeUnits[offset]=(uint16_t)(0xdc00+(c&0x3ff));
                    }
                }
                break;
            default:
                /* reserved, must never occur */
                fprintf(stderr, "internal error: byte sequence reached reserved action code, entry 0x%02x: 0x%s (U+%x)\n",
                    (int)entry, printBytes(buffer, bytes, length), (int)c);
                return FALSE;
            }

            return TRUE;
        }
    }
}